

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

double min(DataSet *dataset)

{
  vector<double,_std::allocator<double>_> *pvVar1;
  reference pvVar2;
  double dVar3;
  Shape SVar4;
  uint local_94;
  uint local_88;
  uint i;
  double local_78;
  double result;
  Matrix<double> mat;
  DataSet *dataset_local;
  
  mat.m_functions[6] = (_func_void_Matrix<double>_ptr_void_ptr *)dataset;
  DataSet::matrix((Matrix<double> *)&result,dataset);
  pvVar1 = Matrix<double>::operator[]((Matrix<double> *)&result,0);
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](pvVar1,0);
  local_78 = *pvVar2;
  local_88 = 0;
  while( true ) {
    SVar4 = Matrix<double>::shape((Matrix<double> *)&result);
    local_94 = SVar4.n_row;
    if (local_94 <= local_88) break;
    pvVar1 = Matrix<double>::operator[]((Matrix<double> *)&result,local_88);
    dVar3 = min(pvVar1,1);
    if (dVar3 < local_78) {
      pvVar1 = Matrix<double>::operator[]((Matrix<double> *)&result,local_88);
      local_78 = min(pvVar1,1);
    }
    local_88 = local_88 + 1;
  }
  Matrix<double>::~Matrix((Matrix<double> *)&result);
  return local_78;
}

Assistant:

double min(const DataSet& dataset){
    Matrix_d mat=dataset.matrix();
    double result=mat[0][0];
    for(unsigned i=0;i<mat.shape().n_row;++i){
        if(result>min(mat[i], 1)) result=min(mat[i], 1);
    }
    return result;
}